

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

memory_resource * std::pmr::local_malloc_free_resource(void)

{
  int iVar1;
  memory_resource *in_RAX;
  memory_resource *pmVar2;
  
  if (local_malloc_free_resource()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&local_malloc_free_resource()::instance);
    if (iVar1 != 0) {
      __cxa_atexit(std::pmr::memory_resource::~memory_resource,&local_malloc_free_resource::instance
                   ,&__dso_handle);
      pmVar2 = (memory_resource *)__cxa_guard_release(&local_malloc_free_resource()::instance);
      return pmVar2;
    }
  }
  return in_RAX;
}

Assistant:

static
memory_resource* local_malloc_free_resource()
{
    struct malloc_free_resource : memory_resource {
        [[nodiscard]] void *
            do_allocate(size_t bytes, size_t alignment) override
        {
            // While this class is local, there is no need to check the
            // alignment, as we never ask for overaligned memory
            //if (alignment > alignof(max_align_t)) {
            //    throw bad_alloc();
            //}
            void *rv = malloc(bytes);
            if (nullptr == rv) {
                throw bad_alloc();
            }
            return rv;
        }

        void do_deallocate(void                    *p,
                           [[maybe_unused]] size_t  bytes,
                            [[maybe_unused]] size_t alignment) override
        {
            free(p);
        }

        bool do_is_equal(const memory_resource& that) const noexcept override
        {
            return nullptr != dynamic_cast<const malloc_free_resource*>(&that);
        }
    };

    static malloc_free_resource instance;
    return &instance;
}